

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lopcodes.c
# Opt level: O0

void ravi_print_function(membuff_t *mb,Proto *f,int full)

{
  int iVar1;
  int local_20;
  int n;
  int i;
  int full_local;
  Proto *f_local;
  membuff_t *mb_local;
  
  iVar1 = f->sizep;
  PrintHeader(mb,f);
  PrintCode(mb,f);
  if (full != 0) {
    PrintDebug(mb,f);
  }
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    ravi_print_function(mb,f->p[local_20],full);
  }
  return;
}

Assistant:

static void ravi_print_function(membuff_t *mb, const Proto* f, int full)
{
  int i, n = f->sizep;
  PrintHeader(mb, f);
  PrintCode(mb, f);
  if (full) PrintDebug(mb, f);
  for (i = 0; i<n; i++) ravi_print_function(mb, f->p[i], full);
}